

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O3

void __thiscall Scene::Scene(Scene *this,string *n,Decorator *dec)

{
  list<Observer_*,_std::allocator<Observer_*>_> *plVar1;
  pointer pcVar2;
  
  plVar1 = &(this->super_Observable).observers;
  (this->super_Observable).observers.super__List_base<Observer_*,_std::allocator<Observer_*>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->super_Observable).observers.super__List_base<Observer_*,_std::allocator<Observer_*>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->super_Observable).observers.super__List_base<Observer_*,_std::allocator<Observer_*>_>.
  _M_impl._M_node._M_size = 0;
  (this->super_Observable)._vptr_Observable = (_func_int **)&PTR__Scene_00115d20;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar2 = (n->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar2,pcVar2 + n->_M_string_length);
  (this->entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->generateDecorator = dec;
  return;
}

Assistant:

Scene(std::string n, Decorator* dec = new Decorator) :
        name(n), generateDecorator(dec) {}